

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O0

Error __thiscall
asmjit::v1_14::BaseBuilder::newInstNode
          (BaseBuilder *this,InstNode **out,InstId instId,InstOptions instOptions,uint32_t opCount)

{
  InstNode *pIVar1;
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined8 *in_RSI;
  long in_RDI;
  uint in_R8D;
  InstNode *node;
  uint32_t opCapacity;
  char *in_stack_00000320;
  int in_stack_0000032c;
  char *in_stack_00000330;
  size_t in_stack_ffffffffffffff28;
  ZoneAllocator *in_stack_ffffffffffffff30;
  undefined8 in_stack_ffffffffffffff38;
  Error err;
  BaseEmitter *in_stack_ffffffffffffff40;
  InstNode *pIVar2;
  InstNode *local_a0;
  InstNode *local_98;
  uint local_90;
  uint local_8c;
  undefined4 local_88;
  undefined4 local_84;
  undefined8 *local_80;
  Error local_6c;
  uint local_64;
  InstNode **local_60;
  undefined8 local_58;
  uint local_50;
  uint local_4c;
  undefined4 local_48;
  undefined4 local_44;
  InstNode *local_38;
  undefined1 local_2e;
  undefined1 local_2d;
  undefined1 local_2c;
  undefined1 local_2b;
  undefined1 local_2a;
  undefined1 local_29;
  InstNode *local_20;
  byte local_12;
  undefined1 local_11;
  undefined4 local_10;
  undefined4 local_c;
  InstNode *local_8;
  
  err = (Error)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  local_90 = 6;
  if (in_R8D < 5) {
    local_90 = 4;
  }
  if (local_90 < 4) {
    DebugUtils::assertionFailed(in_stack_00000330,in_stack_0000032c,in_stack_00000320);
  }
  local_8c = in_R8D;
  local_88 = in_ECX;
  local_84 = in_EDX;
  local_80 = in_RSI;
  local_64 = local_90;
  pIVar1 = ZoneAllocator::allocT<asmjit::v1_14::InstNode>
                     (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  local_98 = pIVar1;
  if (pIVar1 == (InstNode *)0x0) {
    DebugUtils::errored(1);
    local_6c = BaseEmitter::reportError
                         (in_stack_ffffffffffffff40,err,(char *)in_stack_ffffffffffffff30);
  }
  else {
    local_58 = 0x40;
    local_60 = &local_a0;
    pIVar2 = (InstNode *)0x0;
    if (pIVar1 != (InstNode *)0x0) {
      local_44 = local_84;
      local_48 = local_88;
      local_4c = local_8c;
      local_50 = local_90;
      local_2b = 1;
      local_2c = 8;
      local_2d = 9;
      local_2e = 0x20;
      local_2a = 0x29;
      local_29 = 1;
      *(undefined8 *)pIVar1 = 0;
      *(undefined8 *)(pIVar1 + 8) = 0;
      pIVar1[0x10] = (InstNode)0x1;
      local_12 = *(byte *)(in_RDI + 0x1b0);
      pIVar1[0x11] = (InstNode)(local_12 | 0x29);
      pIVar1[0x12] = (InstNode)0x0;
      pIVar1[0x13] = (InstNode)0x0;
      *(undefined4 *)(pIVar1 + 0x14) = 0;
      *(undefined8 *)(pIVar1 + 0x18) = 0;
      *(undefined8 *)(pIVar1 + 0x20) = 0;
      *(undefined8 *)(pIVar1 + 0x28) = 0;
      local_8 = pIVar1 + 0x30;
      local_c = local_84;
      local_10 = local_88;
      *(undefined4 *)local_8 = local_84;
      *(undefined4 *)(pIVar1 + 0x34) = local_88;
      pIVar2 = pIVar1;
      local_a0 = pIVar1;
      local_38 = pIVar1;
      local_20 = pIVar1;
      local_11 = local_2a;
      memset(pIVar1 + 0x38,0,8);
      pIVar1[0x13] = SUB41(local_50,0);
      pIVar1[0x12] = SUB41(local_4c,0);
    }
    *local_80 = pIVar2;
    local_6c = 0;
  }
  return local_6c;
}

Assistant:

Error BaseBuilder::newInstNode(InstNode** out, InstId instId, InstOptions instOptions, uint32_t opCount) {
  uint32_t opCapacity = InstNode::capacityOfOpCount(opCount);
  ASMJIT_ASSERT(opCapacity >= InstNode::kBaseOpCapacity);

  InstNode* node = _allocator.allocT<InstNode>(InstNode::nodeSizeOfOpCapacity(opCapacity));
  if (ASMJIT_UNLIKELY(!node))
    return reportError(DebugUtils::errored(kErrorOutOfMemory));

  *out = new(Support::PlacementNew{node}) InstNode(this, instId, instOptions, opCount, opCapacity);
  return kErrorOk;
}